

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  void *in_RSI;
  undefined1 *in_RDI;
  ImFontAtlas *this_00;
  ImGuiNextWindowData *in_stack_fffffffffffffeb0;
  void *local_148;
  ImPool<ImGuiTabBar> *in_stack_fffffffffffffec0;
  ImGuiInputTextState *in_stack_fffffffffffffed0;
  ImFont *in_stack_fffffffffffffee0;
  ImDrawListSharedData *in_stack_fffffffffffffef0;
  ImDrawListSharedData *in_stack_fffffffffffffef8;
  ImDrawList *in_stack_ffffffffffffff00;
  ImGuiIO *in_stack_ffffffffffffff20;
  ImVec2 local_5c;
  ImVec2 local_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  ImVec2 local_3c;
  undefined1 local_31;
  ImGuiNextWindowData *local_30;
  void *local_28;
  void *local_10;
  
  local_10 = in_RSI;
  ImGuiIO::ImGuiIO(in_stack_ffffffffffffff20);
  ImGuiStyle::ImGuiStyle((ImGuiStyle *)in_stack_ffffffffffffff20);
  ImDrawListSharedData::ImDrawListSharedData(in_stack_fffffffffffffef0);
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a28));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a38));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a48));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a58));
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x197008);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x1aa8));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x1af0));
  ImGuiNextWindowData::ImGuiNextWindowData(in_stack_fffffffffffffeb0);
  ImGuiNextItemData::ImGuiNextItemData((ImGuiNextItemData *)0x197060);
  ImVector<ImGuiColorMod>::ImVector((ImVector<ImGuiColorMod> *)(in_RDI + 0x1ba8));
  ImVector<ImGuiStyleMod>::ImVector((ImVector<ImGuiStyleMod> *)(in_RDI + 0x1bb8));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)(in_RDI + 0x1bc8));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x1bd8));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x1be8));
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffeb0);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffeb0);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffeb0);
  ImDrawData::ImDrawData((ImDrawData *)in_stack_fffffffffffffeb0);
  ImDrawDataBuilder::ImDrawDataBuilder((ImDrawDataBuilder *)in_stack_fffffffffffffee0);
  ImDrawList::ImDrawList(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ImDrawList::ImDrawList(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ImGuiPayload::ImGuiPayload((ImGuiPayload *)0x197203);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  ImVector<unsigned_char>::ImVector((ImVector<unsigned_char> *)(in_RDI + 0x1fb0));
  ImPool<ImGuiTabBar>::ImPool(in_stack_fffffffffffffec0);
  ImVector<ImGuiPtrOrIndex>::ImVector((ImVector<ImGuiPtrOrIndex> *)(in_RDI + 0x2000));
  ImVector<ImGuiShrinkWidthItem>::ImVector((ImVector<ImGuiShrinkWidthItem> *)(in_RDI + 0x2010));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2020));
  ImGuiInputTextState::ImGuiInputTextState(in_stack_fffffffffffffed0);
  ImFont::ImFont(in_stack_fffffffffffffee0);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 0x2f4c));
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x2f70));
  this_00 = (ImFontAtlas *)(in_RDI + 0x2f80);
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)this_00);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2f90));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2f98));
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x197364);
  ImVector<ImGuiSettingsHandler>::ImVector((ImVector<ImGuiSettingsHandler> *)(in_RDI + 0x2fb8));
  ImChunkStream<ImGuiWindowSettings>::ImChunkStream((ImChunkStream<ImGuiWindowSettings> *)0x19739a);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x1973b5);
  *in_RDI = 0;
  in_RDI[1] = -(local_10 == (void *)0x0) & 1;
  *(undefined8 *)(in_RDI + 0x1920) = 0;
  *(undefined4 *)(in_RDI + 0x192c) = 0;
  *(undefined4 *)(in_RDI + 0x1928) = 0;
  local_31 = 0;
  if (local_10 == (void *)0x0) {
    in_stack_fffffffffffffeb0 =
         (ImGuiNextWindowData *)ImGui::MemAlloc((size_t)in_stack_fffffffffffffeb0);
    local_148 = operator_new(0x78);
    local_31 = 1;
    local_30 = in_stack_fffffffffffffeb0;
    local_28 = local_148;
    ImFontAtlas::ImFontAtlas(this_00);
  }
  else {
    local_148 = local_10;
  }
  *(void **)(in_RDI + 0xa8) = local_148;
  *(undefined8 *)(in_RDI + 0x1a00) = 0;
  *(undefined4 *)(in_RDI + 0x1a08) = 0;
  *(undefined4 *)(in_RDI + 0x1a10) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1a0c) = 0xffffffff;
  in_RDI[0x1a16] = 0;
  in_RDI[0x1a15] = 0;
  in_RDI[0x1a14] = 0;
  in_RDI[0x1a17] = 0;
  *(undefined4 *)(in_RDI + 0x1a18) = 0;
  *(undefined8 *)(in_RDI + 0x1a20) = 0;
  *(undefined4 *)(in_RDI + 0x1a78) = 0;
  *(undefined8 *)(in_RDI + 0x1a80) = 0;
  *(undefined8 *)(in_RDI + 0x1a88) = 0;
  *(undefined8 *)(in_RDI + 0x1a90) = 0;
  *(undefined8 *)(in_RDI + 0x1a98) = 0;
  *(undefined8 *)(in_RDI + 0x1aa0) = 0;
  *(undefined4 *)(in_RDI + 0x1ab0) = 0;
  *(undefined4 *)(in_RDI + 0x1ab4) = 0;
  in_RDI[0x1ab8] = 0;
  *(undefined4 *)(in_RDI + 0x1abc) = 0;
  *(undefined4 *)(in_RDI + 0x1ac4) = 0;
  *(undefined4 *)(in_RDI + 0x1ac0) = 0;
  *(undefined4 *)(in_RDI + 0x1ac8) = 0;
  *(undefined4 *)(in_RDI + 0x1acc) = 0;
  *(undefined4 *)(in_RDI + 0x1ad0) = 0;
  in_RDI[0x1ad4] = 0;
  in_RDI[0x1ad5] = 0;
  in_RDI[0x1ad6] = 0;
  in_RDI[0x1ad7] = 0;
  in_RDI[0x1ad8] = 0;
  *(undefined4 *)(in_RDI + 0x1adc) = 0;
  *(undefined4 *)(in_RDI + 0x1ae0) = 0;
  *(undefined8 *)(in_RDI + 0x1ae8) = 0;
  ImVec2::ImVec2(&local_3c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x1af0) = local_3c;
  *(undefined8 *)(in_RDI + 0x1af8) = 0;
  *(undefined4 *)(in_RDI + 0x1b00) = 0;
  *(undefined4 *)(in_RDI + 0x1b04) = 0;
  *(undefined4 *)(in_RDI + 0x1b08) = 0;
  in_RDI[0x1b0c] = 0;
  in_RDI[0x1b0d] = 0;
  *(undefined8 *)(in_RDI + 0x1b10) = 0;
  *(undefined4 *)(in_RDI + 0x1b18) = 0;
  *(undefined4 *)(in_RDI + 0x1b1c) = 0;
  *(undefined8 *)(in_RDI + 0x1bf8) = 0;
  *(undefined4 *)(in_RDI + 0x1c14) = 0;
  *(undefined4 *)(in_RDI + 0x1c10) = 0;
  *(undefined4 *)(in_RDI + 0x1c0c) = 0;
  *(undefined4 *)(in_RDI + 0x1c08) = 0;
  *(undefined4 *)(in_RDI + 0x1c04) = 0;
  *(undefined4 *)(in_RDI + 0x1c00) = 0;
  *(undefined4 *)(in_RDI + 0x1c28) = 0;
  *(undefined4 *)(in_RDI + 0x1c20) = 0;
  *(undefined4 *)(in_RDI + 0x1c1c) = 0;
  *(undefined4 *)(in_RDI + 0x1c18) = 0;
  *(undefined4 *)(in_RDI + 0x1c24) = 0;
  *(undefined4 *)(in_RDI + 0x1c2c) = 0;
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  *(undefined8 *)(in_RDI + 0x1c30) = local_4c;
  *(undefined8 *)(in_RDI + 0x1c38) = uStack_44;
  *(undefined4 *)(in_RDI + 0x1c40) = 0;
  *(undefined4 *)(in_RDI + 0x1c44) = 0;
  *(undefined4 *)(in_RDI + 0x1c48) = 0x7fffffff;
  in_RDI[0x1c4c] = 0;
  in_RDI[0x1c4d] = 0;
  in_RDI[0x1c4e] = 1;
  in_RDI[0x1c4f] = 0;
  in_RDI[0x1c50] = 0;
  in_RDI[0x1c51] = 0;
  in_RDI[0x1c52] = 0;
  *(undefined4 *)(in_RDI + 0x1c54) = 0;
  in_RDI[0x1c68] = 0;
  in_RDI[0x1c69] = 0;
  *(undefined4 *)(in_RDI + 0x1c6c) = 0;
  *(undefined4 *)(in_RDI + 0x1c70) = 0;
  *(undefined4 *)(in_RDI + 0x1c74) = 0;
  *(undefined4 *)(in_RDI + 0x1c80) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1c7c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1c78) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x1d18) = 0;
  *(undefined4 *)(in_RDI + 0x1d20) = 0;
  *(undefined8 *)(in_RDI + 0x1d38) = 0;
  *(undefined8 *)(in_RDI + 0x1d30) = 0;
  *(undefined8 *)(in_RDI + 0x1d28) = 0;
  *(undefined4 *)(in_RDI + 0x1d44) = 0;
  *(undefined4 *)(in_RDI + 0x1d40) = 0;
  in_RDI[0x1d48] = 0;
  *(undefined8 *)(in_RDI + 0x1d58) = 0;
  *(undefined8 *)(in_RDI + 0x1d50) = 0;
  *(undefined4 *)(in_RDI + 0x1d64) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1d60) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1d6c) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1d68) = 0x7fffffff;
  in_RDI[0x1d70] = 0;
  *(undefined4 *)(in_RDI + 0x1dd0) = 0;
  *(char **)(in_RDI + 0x1e18) = "##Background";
  *(char **)(in_RDI + 0x1ec0) = "##Foreground";
  *(undefined4 *)(in_RDI + 0x1f28) = 0;
  in_RDI[0x1f2e] = 0;
  in_RDI[0x1f2d] = 0;
  in_RDI[0x1f2c] = 0;
  *(undefined4 *)(in_RDI + 0x1f30) = 0;
  *(undefined4 *)(in_RDI + 0x1f34) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1f38) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1f90) = 0;
  *(undefined4 *)(in_RDI + 0x1f94) = 0;
  *(undefined4 *)(in_RDI + 0x1f98) = 0;
  *(undefined4 *)(in_RDI + 0x1f9c) = 0;
  *(undefined4 *)(in_RDI + 0x1fa0) = 0;
  *(undefined4 *)(in_RDI + 0x1fa4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1fa8) = 0;
  *(undefined8 *)(in_RDI + 0x1fc0) = 0;
  *(undefined8 *)(in_RDI + 0x1fc8) = 0;
  *(undefined8 *)(in_RDI + 0x1fd0) = 0;
  ImVec2::ImVec2(&local_54,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x2020) = local_54;
  *(undefined4 *)(in_RDI + 0x2f30) = 0;
  *(undefined4 *)(in_RDI + 0x2f34) = 0xa900000;
  *(undefined4 *)(in_RDI + 0x2f3c) = 0;
  *(undefined4 *)(in_RDI + 0x2f38) = 0;
  *(undefined4 *)(in_RDI + 0x2f48) = 0x7f7fffff;
  *(undefined4 *)(in_RDI + 0x2f44) = 0x7f7fffff;
  *(undefined4 *)(in_RDI + 0x2f40) = 0x7f7fffff;
  in_RDI[0x2f5c] = 0;
  *(undefined4 *)(in_RDI + 0x2f60) = 0;
  *(undefined4 *)(in_RDI + 0x2f64) = 0x3c23d70a;
  *(undefined4 *)(in_RDI + 0x2f68) = 0;
  *(undefined4 *)(in_RDI + 0x2f6c) = 0;
  ImVec2::ImVec2(&local_5c,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0x2f98) = local_5c;
  *(undefined8 *)(in_RDI + 0x2f90) = *(undefined8 *)(in_RDI + 0x2f98);
  in_RDI[0x2fa0] = 0;
  *(undefined4 *)(in_RDI + 0x2fa4) = 0;
  in_RDI[0x2fd8] = 0;
  *(undefined4 *)(in_RDI + 0x2fdc) = 0;
  *(undefined8 *)(in_RDI + 0x2fe0) = 0;
  *(undefined4 *)(in_RDI + 0x2ff8) = 0x7f7fffff;
  in_RDI[0x2ffc] = 0;
  *(undefined4 *)(in_RDI + 0x3000) = 0;
  *(undefined4 *)(in_RDI + 0x3008) = 2;
  *(undefined4 *)(in_RDI + 0x3004) = 2;
  in_RDI[0x300c] = 0;
  *(undefined4 *)(in_RDI + 0x3010) = 0;
  memset(in_RDI + 0x3014,0,0x1e0);
  *(undefined4 *)(in_RDI + 0x31f4) = 0;
  *(undefined4 *)(in_RDI + 0x31f8) = 0;
  *(undefined4 *)(in_RDI + 0x3204) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3200) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x31fc) = 0xffffffff;
  memset(in_RDI + 0x3208,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas) : BackgroundDrawList(&DrawListSharedData), ForegroundDrawList(&DrawListSharedData)
    {
        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        TestEngineHookItems = false;
        TestEngineHookIdInfo = 0;
        TestEngine = NULL;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowTimer = 0.0f;

        HoveredId = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdPreviousFrame = 0;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingNavInputMask = 0x00;
        ActiveIdUsingKeyInputMask = 0x00;
        ActiveIdClickOffset = ImVec2(-1,-1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavInputId = 0;
        NavJustTabbedId = NavJustMovedToId = NavJustMovedToFocusScopeId = NavNextActivateId = 0;
        NavJustMovedToKeyMods = ImGuiKeyModFlags_None;
        NavInputSource = ImGuiInputSource_None;
        NavScoringRect = ImRect();
        NavScoringCount = 0;
        NavLayer = ImGuiNavLayer_Main;
        NavIdTabCounter = INT_MAX;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveFromClampedRefRect = false;
        NavMoveRequest = false;
        NavMoveRequestFlags = ImGuiNavMoveFlags_None;
        NavMoveRequestForward = ImGuiNavForward_None;
        NavMoveRequestKeyMods = ImGuiKeyModFlags_None;
        NavMoveDir = NavMoveDirLast = NavMoveClipDir = ImGuiDir_None;
        NavWrapRequestWindow = NULL;
        NavWrapRequestFlags = ImGuiNavMoveFlags_None;

        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;

        FocusRequestCurrWindow = FocusRequestNextWindow = NULL;
        FocusRequestCurrCounterRegular = FocusRequestCurrCounterTabStop = INT_MAX;
        FocusRequestNextCounterRegular = FocusRequestNextCounterTabStop = INT_MAX;
        FocusTabPressed = false;

        DimBgRatio = 0.0f;
        BackgroundDrawList._OwnerName = "##Background"; // Give it a name for debugging
        ForegroundDrawList._OwnerName = "##Foreground"; // Give it a name for debugging
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        CurrentTabBar = NULL;

        LastValidMousePos = ImVec2(0.0f, 0.0f);
        TempInputId = 0;
        ColorEditOptions = ImGuiColorEditFlags__OptionsDefault;
        ColorEditLastHue = ColorEditLastSat = 0.0f;
        ColorEditLastColor[0] = ColorEditLastColor[1] = ColorEditLastColor[2] = FLT_MAX;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        TooltipOverrideCount = 0;

        PlatformImePos = PlatformImeLastPos = ImVec2(FLT_MAX, FLT_MAX);

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugItemPickerActive = false;
        DebugItemPickerBreakId = 0;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }